

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O0

uint32_t __thiscall
ddd::DaTrie<true,_true,_false>::excheck_
          (DaTrie<true,_true,_false> *this,Edge *edge,
          vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_> *blocks)

{
  uint32_t uVar1;
  size_type sVar2;
  vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_> *blocks_00;
  const_reference pvVar3;
  Edge *in_RDX;
  DaTrie<true,_true,_false> *in_RSI;
  long in_RDI;
  uint32_t base;
  size_type last_block;
  uint32_t block_pos;
  uint block_pos_00;
  
  if (*(int *)(in_RDI + 0x60) != -1) {
    block_pos_00 = *(uint *)(in_RDI + 0x60);
    sVar2 = std::vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>::size
                      ((vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_> *)in_RDX);
    blocks_00 = (vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_> *)(sVar2 - 1);
    do {
      if ((blocks_00 !=
           (vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_> *)(ulong)block_pos_00) &&
         (uVar1 = excheck_in_block_(in_RSI,in_RDX,block_pos_00,blocks_00), uVar1 != 0xffffffff)) {
        *(uint *)(in_RDI + 0x60) = block_pos_00;
        return uVar1;
      }
      pvVar3 = std::vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>::operator[]
                         ((vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_> *)in_RDX,
                          (ulong)block_pos_00);
      block_pos_00 = pvVar3->next;
    } while (block_pos_00 != *(uint32_t *)(in_RDI + 0x60));
  }
  return 0xffffffff;
}

Assistant:

uint32_t excheck_(const Edge& edge, const std::vector<BlockLink>& blocks) {
    assert(0 < edge.size());

    if (head_pos_ == NOT_FOUND) {
      return NOT_FOUND;
    }

    auto block_pos = head_pos_;
    auto last_block = blocks.size() - 1;

    do {
      if (last_block == block_pos) {
        continue;
      }
      auto base = excheck_in_block_(edge, block_pos, blocks);
      if (base != NOT_FOUND) {
        head_pos_ = block_pos; // update for remaining
        return base;
      }
    } while ((block_pos = blocks[block_pos].next) != head_pos_);

    return NOT_FOUND;
  }